

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extractor.cpp
# Opt level: O3

void __thiscall Extractor::setFile(Extractor *this,char *file_name)

{
  char *pcVar1;
  FILE *pFVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  if (this->_file != (FILE *)0x0) {
    _free(this,file_name);
  }
  pcVar1 = (char *)(this->_file_name)._M_string_length;
  strlen(file_name);
  std::__cxx11::string::_M_replace((ulong)&this->_file_name,0,pcVar1,(ulong)file_name);
  pFVar2 = fopen(file_name,"rb");
  this->_file = (FILE *)pFVar2;
  if (pFVar2 != (FILE *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"unable to open file (","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_90);
  local_70 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_70 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_50 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Extractor::setFile(const char *file_name)
{
	if (_file) {
		_free();
	}
	_file_name = file_name;
	_file = fopen(file_name, "rb");
	if (!_file) {
		throw std::runtime_error(std::string("unable to open file (") + file_name + ")");
	}
}